

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::CleanUpForInCache(FunctionBody *this,bool isShutdown)

{
  ProfileId PVar1;
  uint uVar2;
  EnumeratorCache *obj;
  ScriptContext *this_00;
  CacheAllocator *allocator;
  EnumeratorCache *forInCacheArray;
  uint profiledForInLoopCount;
  bool isShutdown_local;
  FunctionBody *this_local;
  
  PVar1 = GetProfiledForInLoopCount(this);
  uVar2 = (uint)PVar1;
  if ((uVar2 != 0) &&
     (obj = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)22,Js::EnumeratorCache*>
                      ((FunctionProxy *)this), obj != (EnumeratorCache *)0x0)) {
    if (isShutdown) {
      memset(obj,0,(ulong)uVar2 << 4);
    }
    else {
      this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
      allocator = ScriptContext::GetEnumeratorAllocator(this_00);
      Memory::DeleteArray<Memory::CacheAllocator,Js::EnumeratorCache>(allocator,(ulong)uVar2,obj);
      FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)22,decltype(nullptr)>
                ((FunctionProxy *)this,(void *)0x0);
    }
  }
  return;
}

Assistant:

void FunctionBody::CleanUpForInCache(bool isShutdown)
    {
        uint profiledForInLoopCount = this->GetProfiledForInLoopCount();
        if (profiledForInLoopCount == 0)
        {
            return;
        }
        EnumeratorCache * forInCacheArray = this->GetAuxPtr<AuxPointerType::ForInCacheArray>();
        if (forInCacheArray)
        {
            if (isShutdown)
            {
                memset(forInCacheArray, 0, sizeof(EnumeratorCache) * profiledForInLoopCount);
            }
            else
            {
                AllocatorDeleteArray(CacheAllocator, this->GetScriptContext()->GetEnumeratorAllocator(), profiledForInLoopCount, forInCacheArray);
                this->SetAuxPtr<AuxPointerType::ForInCacheArray>(nullptr);
            }
        }
    }